

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_bd03ee::HandleCacheMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  size_type sVar1;
  cmState *pcVar2;
  cmValue cVar3;
  long *local_50 [2];
  long local_40 [2];
  
  sVar1 = name->_M_string_length;
  if (sVar1 == 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"not given name for CACHE scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    pcVar2 = cmMakefile::GetState(status->Makefile);
    cVar3 = cmState::GetCacheEntryValue(pcVar2,name);
    if (cVar3.Value == (string *)0x0) {
      cVar3.Value = (string *)0x0;
    }
    else {
      pcVar2 = cmMakefile::GetState(status->Makefile);
      cVar3 = cmState::GetCacheEntryProperty(pcVar2,name,propertyName);
    }
    StoreResult<cmValue>(infoType,status->Makefile,variable,cVar3);
  }
  return sVar1 != 0;
}

Assistant:

bool HandleCacheMode(cmExecutionStatus& status, const std::string& name,
                     OutType infoType, const std::string& variable,
                     const std::string& propertyName)
{
  if (name.empty()) {
    status.SetError("not given name for CACHE scope.");
    return false;
  }

  cmValue value = nullptr;
  if (status.GetMakefile().GetState()->GetCacheEntryValue(name)) {
    value = status.GetMakefile().GetState()->GetCacheEntryProperty(
      name, propertyName);
  }
  StoreResult(infoType, status.GetMakefile(), variable, value);
  return true;
}